

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallExpression.cpp
# Opt level: O3

Expression * __thiscall
slang::ast::CallExpression::fromArgs
          (CallExpression *this,Compilation *compilation,Subroutine *subroutine,
          Expression *thisClass,ArgumentListSyntax *argSyntax,SourceRange range,ASTContext *context)

{
  SubroutineSymbol *this_00;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> formalArgs;
  SourceRange range_00;
  SourceRange sourceRange;
  bool bVar1;
  int iVar2;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar3;
  Type *args_1;
  undefined4 extraout_var;
  CallExpression *expr;
  long lVar4;
  ProceduralBlockSymbol *procedure;
  EVP_PKEY_CTX *src;
  DiagCode code;
  SourceLocation args_3;
  SourceRange range_01;
  SmallVector<const_slang::ast::Expression_*,_5UL> boundArgs;
  SourceRange local_b0;
  Expression *local_a0;
  SubroutineSymbol *local_98;
  SmallVectorBase<const_slang::ast::Expression_*> local_90 [2];
  LookupLocation local_50;
  undefined8 local_40 [2];
  
  local_90[0].len = 0;
  local_90[0].cap = 5;
  local_b0.startLoc = (SourceLocation)argSyntax;
  local_b0.endLoc = (SourceLocation)context;
  local_a0 = (Expression *)subroutine;
  local_90[0].data_ = (pointer)local_90[0].firstElement;
  ppSVar3 = std::
            get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                      ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                        *)compilation);
  this_00 = *ppSVar3;
  if ((this_00->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&this_00->super_Scope);
  }
  formalArgs._M_ptr = (this_00->arguments)._M_ptr;
  formalArgs._M_extent._M_extent_value = (this_00->arguments)._M_extent._M_extent_value;
  range_00.endLoc = local_b0.endLoc;
  range_00.startLoc = local_b0.startLoc;
  bVar1 = bindArgs((ArgumentListSyntax *)thisClass,formalArgs,(this_00->super_Symbol).name,range_00,
                   (ASTContext *)range.startLoc,local_90,
                   (bool)((byte)((this_00->flags).m_bits >> 9) & 1));
  local_98 = this_00;
  args_1 = DeclaredType::getType(&this_00->declaredReturnType);
  iVar2 = SmallVectorBase<const_slang::ast::Expression_*>::copy(local_90,(EVP_PKEY_CTX *)this,src);
  local_40[0] = CONCAT44(extraout_var,iVar2);
  args_3 = (SourceLocation)local_40;
  local_50.scope = *(Scope **)range.startLoc;
  local_50.index = *(uint32_t *)((long)range.startLoc + 8);
  expr = BumpAllocator::
         emplace<slang::ast::CallExpression,slang::ast::SubroutineSymbol_const*,slang::ast::Type_const&,slang::ast::Expression_const*&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::LookupLocation,slang::SourceRange&>
                   ((BumpAllocator *)this,&local_98,args_1,&local_a0,
                    (span<const_slang::ast::Expression_*,_18446744073709551615UL> *)args_3,&local_50
                    ,&local_b0);
  if (bVar1) {
    if (((*(byte *)((long)range.startLoc + 0x11) & 0x18) != 0) && (this_00->subroutineKind == Task))
    {
      code.subsystem = Expressions;
      code.code = 0x9c;
      for (lVar4 = *(long *)range.startLoc; lVar4 != 0; lVar4 = *(long *)(*(int **)(lVar4 + 8) + 8))
      {
        iVar2 = **(int **)(lVar4 + 8);
        if (iVar2 != 0x3a) {
          if (iVar2 == 0x40) {
            code.subsystem = Expressions;
            code.code = 0x9d;
          }
          break;
        }
      }
      sourceRange.endLoc = local_b0.endLoc;
      sourceRange.startLoc = local_b0.startLoc;
      ASTContext::addDiag((ASTContext *)range.startLoc,code,sourceRange);
      expr = (CallExpression *)Expression::badExpr((Compilation *)this,&expr->super_Expression);
      goto LAB_00373f73;
    }
    bVar1 = SubroutineSymbol::hasOutputArgs(this_00);
    range_01.endLoc = args_3;
    range_01.startLoc = local_b0.endLoc;
    bVar1 = checkOutputArgs((ast *)range.startLoc,(ASTContext *)(ulong)bVar1,local_b0.startLoc._0_1_
                            ,range_01);
    if (bVar1) {
      if ((((local_a0 == (Expression *)0x0) && (this_00->subroutineKind == Function)) &&
          (procedure = ASTContext::getProceduralBlock((ASTContext *)range.startLoc),
          procedure != (ProceduralBlockSymbol *)0x0)) &&
         (bVar1 = Scope::isUninstantiated(*(Scope **)range.startLoc), !bVar1)) {
        addSubroutineDrivers(&procedure->super_Symbol,this_00,&expr->super_Expression);
      }
      goto LAB_00373f73;
    }
  }
  expr = (CallExpression *)Expression::badExpr((Compilation *)this,&expr->super_Expression);
LAB_00373f73:
  if (local_90[0].data_ != (pointer)local_90[0].firstElement) {
    operator_delete(local_90[0].data_);
  }
  return &expr->super_Expression;
}

Assistant:

Expression& CallExpression::fromArgs(Compilation& compilation, const Subroutine& subroutine,
                                     const Expression* thisClass,
                                     const ArgumentListSyntax* argSyntax, SourceRange range,
                                     const ASTContext& context) {
    SmallVector<const Expression*> boundArgs;
    const SubroutineSymbol& symbol = *std::get<0>(subroutine);
    bool bad = !bindArgs(argSyntax, symbol.getArguments(), symbol.name, range, context, boundArgs,
                         symbol.flags.has(MethodFlags::BuiltIn));

    auto result = compilation.emplace<CallExpression>(&symbol, symbol.getReturnType(), thisClass,
                                                      boundArgs.copy(compilation),
                                                      context.getLocation(), range);
    if (bad)
        return badExpr(compilation, result);

    if (context.flags.has(ASTFlags::Function | ASTFlags::Final) &&
        symbol.subroutineKind == SubroutineKind::Task) {
        const Scope* scope = context.scope;
        while (scope && scope->asSymbol().kind == SymbolKind::StatementBlock)
            scope = scope->asSymbol().getParentScope();

        if (scope && scope->asSymbol().kind == SymbolKind::Subroutine)
            context.addDiag(diag::TaskFromFunction, range);
        else
            context.addDiag(diag::TaskFromFinal, range);

        return badExpr(compilation, result);
    }

    if (!checkOutputArgs(context, symbol.hasOutputArgs(), range))
        return badExpr(compilation, result);

    // If this subroutine is invoked from a procedure, register drivers for this
    // particular procedure to detect multiple driver violations.
    if (!thisClass && symbol.subroutineKind == SubroutineKind::Function) {
        if (auto proc = context.getProceduralBlock(); proc && !context.scope->isUninstantiated())
            addSubroutineDrivers(*proc, symbol, *result);
    }

    return *result;
}